

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Torsion.hpp
# Opt level: O2

RealType __thiscall OpenMD::Torsion::getValue(Torsion *this,int snapshotNo)

{
  SnapshotManager *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  double dVar3;
  double dVar4;
  RealType RVar5;
  Vector3d A;
  Vector3d B;
  Vector3d r43;
  Vector3d r32;
  Vector3d pos4;
  Vector3d r21;
  Vector3d pos3;
  Vector3d pos2;
  Vector3d pos1;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  StuntDouble::getPos((Vector3d *)&local_48,
                      &(*(this->super_ShortRangeInteraction).atoms_.
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start)->super_StuntDouble,snapshotNo);
  StuntDouble::getPos((Vector3d *)&local_60,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1]->super_StuntDouble,snapshotNo);
  StuntDouble::getPos((Vector3d *)&local_78,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[2]->super_StuntDouble,snapshotNo);
  StuntDouble::getPos((Vector3d *)&local_a8,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[3]->super_StuntDouble,snapshotNo);
  operator-(&local_c0,&local_48,&local_60);
  Vector<double,_3U>::Vector(&local_90,&local_c0);
  pSVar1 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar2 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,snapshotNo);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var,iVar2),(Vector3d *)&local_90);
  operator-(&local_d8,&local_60,&local_78);
  Vector<double,_3U>::Vector(&local_c0,&local_d8);
  pSVar1 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar2 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,snapshotNo);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_00,iVar2),(Vector3d *)&local_c0);
  operator-(&local_108,&local_78,&local_a8);
  Vector<double,_3U>::Vector(&local_d8,&local_108);
  pSVar1 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar2 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,snapshotNo);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_01,iVar2),(Vector3d *)&local_d8);
  cross<double>((Vector3<double> *)&local_108,(Vector3<double> *)&local_90,
                (Vector3<double> *)&local_c0);
  dVar3 = Vector<double,_3U>::length(&local_108);
  cross<double>((Vector3<double> *)&local_f0,(Vector3<double> *)&local_c0,
                (Vector3<double> *)&local_d8);
  dVar4 = Vector<double,_3U>::length(&local_f0);
  if (1e-06 <= dVar4 * dVar3) {
    Vector<double,_3U>::normalize(&local_108);
    Vector<double,_3U>::normalize(&local_f0);
    dVar4 = dot<double,3u>(&local_108,&local_f0);
    dVar3 = 1.0;
    if (dVar4 <= 1.0) {
      dVar3 = dVar4;
    }
    dVar4 = -1.0;
    if (-1.0 <= dVar3) {
      dVar4 = dVar3;
    }
    RVar5 = acos(dVar4);
  }
  else {
    RVar5 = NAN;
  }
  return RVar5;
}

Assistant:

RealType getValue(int snapshotNo) {
      Vector3d pos1 = atoms_[0]->getPos(snapshotNo);
      Vector3d pos2 = atoms_[1]->getPos(snapshotNo);
      Vector3d pos3 = atoms_[2]->getPos(snapshotNo);
      Vector3d pos4 = atoms_[3]->getPos(snapshotNo);

      Vector3d r21 = pos1 - pos2;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r21);
      Vector3d r32 = pos2 - pos3;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r32);
      Vector3d r43 = pos3 - pos4;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r43);

      //  Calculate the cross products and distances
      Vector3d A  = cross(r21, r32);
      RealType rA = A.length();
      Vector3d B  = cross(r32, r43);
      RealType rB = B.length();

      /*
         If either of the two cross product vectors is tiny, that means
         the three atoms involved are colinear, and the torsion angle is
         going to be undefined.  The easiest check for this problem is
         to use the product of the two lengths.
      */
      if (rA * rB < OpenMD::epsilon) return numeric_limits<double>::quiet_NaN();

      A.normalize();
      B.normalize();

      //  Calculate the sin and cos
      RealType cos_phi = dot(A, B);
      if (cos_phi > 1.0) cos_phi = 1.0;
      if (cos_phi < -1.0) cos_phi = -1.0;
      return acos(cos_phi);
    }